

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86MOVSXD(uchar *stream,x86Reg dst,x86Size size,x86Reg index,int multiplier,x86Reg base,
             int shift)

{
  uint uVar1;
  uchar *puVar2;
  uchar *start;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  x86Reg dst_local;
  uchar *stream_local;
  
  uVar1 = encodeRex(stream,true,dst,index,base);
  puVar2 = stream + uVar1;
  *puVar2 = 'c';
  uVar1 = encodeAddress(puVar2 + 1,index,multiplier,base,shift,(int)regCode[dst]);
  return ((int)(puVar2 + 1) + uVar1) - (int)stream;
}

Assistant:

int x86MOVSXD(unsigned char *stream, x86Reg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	(void)size;

	unsigned char *start = stream;

	stream += encodeRex(stream, true, dst, index, base);
	*stream++ = 0x63;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[dst]);

	return int(stream - start);
}